

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

size_t fct_ts__tst_cnt_passed(fct_ts_t *ts)

{
  int iVar1;
  size_t sVar2;
  fct_test_t *test_00;
  fct_test_t *test;
  size_t num_itemstest;
  size_t item_itest;
  size_t tally;
  fct_ts_t *ts_local;
  
  item_itest = 0;
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52a
                  ,"size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
  }
  if (ts->mode != ts_mode_end) {
    __assert_fail("((ts)->mode == ts_mode_end)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52b
                  ,"size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
  }
  if (ts != (fct_ts_t *)0xfffffffffffffef0) {
    sVar2 = fct_nlist__size(&ts->test_list);
    for (num_itemstest = 0; num_itemstest != sVar2; num_itemstest = num_itemstest + 1) {
      test_00 = (fct_test_t *)fct_nlist__at(&ts->test_list,num_itemstest);
      iVar1 = fct_test__is_pass(test_00);
      if (iVar1 != 0) {
        item_itest = item_itest + 1;
      }
    }
  }
  return item_itest;
}

Assistant:

static size_t
fct_ts__tst_cnt_passed(fct_ts_t const *ts)
{
    size_t tally =0;

    FCT_ASSERT( ts != NULL );
    FCT_ASSERT( fct_ts__is_end(ts) );

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        if ( fct_test__is_pass(test) )
        {
            tally += 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}